

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# force_ip.cc
# Opt level: O3

void __thiscall rcdiscover::ForceIP::ForceIP(ForceIP *this)

{
  pointer pSVar1;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *__range1;
  SocketLinux *socket;
  pointer this_00;
  
  SocketLinux::createAndBindForAllInterfaces(&this->sockets_,0xf74);
  pSVar1 = (this->sockets_).
           super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->sockets_).
                 super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pSVar1; this_00 = this_00 + 1
      ) {
    SocketLinux::enableBroadcastImpl(this_00);
    SocketLinux::enableNonBlockingImpl(this_00);
  }
  return;
}

Assistant:

ForceIP::ForceIP() :
  sockets_(SocketType::createAndBindForAllInterfaces(3956))
{
  for (auto &socket : sockets_)
  {
    socket.enableBroadcast();
    socket.enableNonBlocking();
  }
}